

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall
MixSegmentTest_TestMultiUserDict_Test::~MixSegmentTest_TestMultiUserDict_Test
          (MixSegmentTest_TestMultiUserDict_Test *this)

{
  void *in_RDI;
  
  ~MixSegmentTest_TestMultiUserDict_Test((MixSegmentTest_TestMultiUserDict_Test *)0x1cd198);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(MixSegmentTest, TestMultiUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", 
        "../test/testdata/userdict.utf8;../test/testdata/userdict.2.utf8");
  vector<string> words;
  string res;

  segment.Cut("忽如一夜春风来，千树万树梨花开", words);
  res = limonp::Join(words.begin(), words.end(), "/");
  ASSERT_EQ("忽如一夜春风来/，/千树万树梨花开", res);
}